

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.c
# Opt level: O3

long * permute_dist(distribution *d,long stream)

{
  undefined1 auVar1 [16];
  int iVar2;
  long *plVar3;
  int *piVar4;
  FILE *pFVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  ulong uVar9;
  uint uVar10;
  ulong unaff_RBX;
  ulong uVar11;
  long lVar12;
  char *__format;
  int tbl;
  size_t __size;
  distribution *unaff_R14;
  long unaff_R15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char acStack_c0 [136];
  ulong uStack_38;
  distribution *pdStack_30;
  long lStack_28;
  
  if (d == (distribution *)0x0) {
    if (permute_dist::dist != (distribution *)0x0) {
      lVar12 = 0;
      if ((long)permute_dist::dist->count <= permute::source + 1) {
        lVar12 = (long)permute_dist::dist->count;
      }
      permute::source = (permute::source - lVar12) + 1;
      return permute::set + permute::source;
    }
    permute_dist_cold_2();
    tbl = (int)d;
    uVar9 = stream;
  }
  else {
    plVar3 = d->permute;
    iVar2 = d->count;
    unaff_R15 = (long)iVar2;
    if (plVar3 != (long *)0x0) {
LAB_00106003:
      permute_dist::dist = d;
      plVar3 = permute(plVar3,iVar2,stream);
      return plVar3;
    }
    __size = unaff_R15 * 8;
    uVar9 = stream;
    plVar3 = (long *)malloc(__size);
    tbl = (int)__size;
    d->permute = plVar3;
    auVar1 = _DAT_001091d0;
    unaff_RBX = stream;
    unaff_R14 = d;
    if (plVar3 != (long *)0x0) {
      if (0 < iVar2) {
        lVar12 = unaff_R15 + -1;
        auVar13._8_4_ = (int)lVar12;
        auVar13._0_8_ = lVar12;
        auVar13._12_4_ = (int)((ulong)lVar12 >> 0x20);
        uVar9 = 0;
        auVar13 = auVar13 ^ _DAT_001091d0;
        auVar14 = _DAT_001091c0;
        do {
          auVar15 = auVar14 ^ auVar1;
          if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                      auVar13._4_4_ < auVar15._4_4_) & 1)) {
            plVar3[uVar9] = uVar9;
          }
          if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
              auVar15._12_4_ <= auVar13._12_4_) {
            plVar3[uVar9 + 1] = uVar9 + 1;
          }
          uVar9 = uVar9 + 2;
          lVar12 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 2;
          auVar14._8_8_ = lVar12 + 2;
        } while ((iVar2 + 1U & 0xfffffffe) != uVar9);
      }
      goto LAB_00106003;
    }
  }
  permute_dist_cold_1();
  uStack_38 = unaff_RBX;
  pdStack_30 = unaff_R14;
  lStack_28 = unaff_R15;
  if (updates == 0) {
    pFVar5 = tbl_open(tbl,"w");
    if (pFVar5 != (FILE *)0x0) {
      return (long *)pFVar5;
    }
    print_prep_cold_1();
    uVar11 = unaff_RBX;
  }
  else {
    uVar10 = (uint)uVar9;
    uVar11 = uVar9 & 0xffffffff;
    if (0 < (int)uVar10) {
      if (insert_segments == 0) {
        pcVar7 = env_config("DSS_PATH",".");
        pcVar6 = tdefs[tbl].name;
        __format = "%s%c%s.u%d";
      }
      else {
        iVar2 = strcmp(tdefs[tbl].name,"orders.tbl");
        if (iVar2 == 0) {
          piVar4 = &insert_lineitem_segment;
        }
        else {
          piVar4 = &insert_orders_segment;
        }
        *piVar4 = *piVar4 + 1;
        pcVar7 = env_config("DSS_PATH",".");
        pcVar6 = tdefs[tbl].name;
        uVar10 = uVar10 + (int)((uVar9 & 0xffffffff) / 10000) * -10000;
        __format = "%s%c%s.u%d.%d";
      }
      sprintf(acStack_c0,__format,pcVar7,0x2f,pcVar6,(ulong)uVar10);
      goto LAB_001061ea;
    }
  }
  if (delete_segments == 0) {
    pcVar6 = env_config("DSS_PATH",".");
    sprintf(acStack_c0,"%s%cdelete.%d",pcVar6,0x2f,(ulong)(uint)-(int)uVar11);
  }
  else {
    delete_segment = delete_segment + 1;
    pcVar6 = env_config("DSS_PATH",".");
    sprintf(acStack_c0,"%s%cdelete.u%d.%d",pcVar6,0x2f,(ulong)((uint)-(int)uVar11 % 10000),
            (ulong)(uint)delete_segment);
  }
LAB_001061ea:
  pFVar8 = fopen64(acStack_c0,"w");
  return (long *)pFVar8;
}

Assistant:

long *
permute_dist(distribution *d, long stream)
	{
	static distribution *dist = NULL;
	int i;
	
	if (d != NULL)
		{
		if (d->permute == (long *)NULL)
			{
			d->permute = (long *)malloc(sizeof(long) * DIST_SIZE(d));
			MALLOC_CHECK(d->permute);
			for (i=0; i < DIST_SIZE(d); i++) 
				*(d->permute + i) = i;
			}
		dist = d;
		return(permute(dist->permute, DIST_SIZE(dist), stream));
		}
	
	
	if (dist != NULL)
		return(permute(NULL, DIST_SIZE(dist), stream));
	else
		INTERNAL_ERROR("Bad call to permute_dist");	
	}